

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

void __thiscall fasttext::Dictionary::initNgrams(Dictionary *this)

{
  int *piVar1;
  iterator __position;
  long lVar2;
  ulong uVar3;
  pointer peVar4;
  subentry sl;
  subentry sm;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  undefined8 local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [24];
  
  if (this->size_ != 0) {
    lVar2 = 0x60;
    uVar3 = 0;
    do {
      peVar4 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      piVar1 = *(int **)((long)peVar4 + lVar2 + -0x30);
      __position._M_current = *(int **)((long)peVar4 + lVar2 + -0x28);
      if (__position._M_current != piVar1) {
        *(int **)((long)peVar4 + lVar2 + -0x28) = piVar1;
        __position._M_current = piVar1;
      }
      local_80 = (undefined1 *)CONCAT44(local_80._4_4_,(int)uVar3);
      if (__position._M_current == *(int **)((long)peVar4 + lVar2 + -0x20)) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)((long)peVar4 + lVar2 + -0x30),__position,
                   (int *)&local_80);
        peVar4 = (this->words_).
                 super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        *__position._M_current = (int)uVar3;
        *(int **)((long)peVar4 + lVar2 + -0x28) = __position._M_current + 1;
      }
      local_80 = local_70;
      local_78 = 0;
      local_70[0] = 0;
      local_50 = 0;
      local_48[0] = 0;
      local_58 = local_48;
      std::__cxx11::string::_M_assign((string *)((long)&(peVar4->word).field_2 + lVar2 + 8U));
      *(undefined8 *)
       ((long)&(peVar4->subwords).super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar2 + 8)
           = local_60;
      peVar4 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      computeNgrams(this,(string *)
                         ((long)&(peVar4->subngram).
                                 super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>
                                 ._M_impl + lVar2 + 0x10),
                    (vector<int,_std::allocator<int>_> *)((long)peVar4 + lVar2 + -0x30),
                    (vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *)
                    ((long)peVar4 + lVar2 + -0x18),
                    (subentry *)((long)&(peVar4->word).field_2 + lVar2 + 8U),
                    (vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *)
                    ((long)&(peVar4->subwords).super__Vector_base<int,_std::allocator<int>_>._M_impl
                    + lVar2 + 0x10),
                    (vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *)
                    ((long)&(peVar4->word)._M_dataplus._M_p + lVar2));
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      if (local_80 != local_70) {
        operator_delete(local_80);
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0xd8;
    } while (uVar3 < (ulong)(long)this->size_);
  }
  return;
}

Assistant:

void Dictionary::initNgrams() {
  for (size_t i = 0; i < size_; i++) {
  	 words_[i].subwords.clear();
 	 words_[i].subwords.push_back(i);
	 subentry sl;
	 subentry sm;
         words_[i].sublemma = sl;
   	 computeNgrams(words_[i].actual_word, words_[i].subwords, words_[i].subngram,words_[i].sublemma,words_[i].submorph,words_[i].subipangram);
  }
}